

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_matcher.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::
string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>
::string_matcher(string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>
                 *this,string_type *str,
                regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  pointer pcVar1;
  size_type sVar2;
  ctype<char> *pcVar3;
  char cVar4;
  size_type sVar5;
  
  std::__cxx11::string::string((string *)this,(string *)str);
  this->end_ = (char_type *)0x0;
  pcVar1 = (this->str_)._M_dataplus._M_p;
  sVar2 = (this->str_)._M_string_length;
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    pcVar3 = (tr->super_cpp_regex_traits<char>).ctype_;
    cVar4 = (**(code **)(*(long *)pcVar3 + 0x20))(pcVar3,(int)pcVar1[sVar5]);
    pcVar1[sVar5] = cVar4;
  }
  this->end_ = (this->str_)._M_dataplus._M_p + (this->str_)._M_string_length;
  return;
}

Assistant:

string_matcher(string_type const &str, Traits const &tr)
          : str_(str)
          , end_()
        {
            typename range_iterator<string_type>::type cur = boost::begin(this->str_);
            typename range_iterator<string_type>::type end = boost::end(this->str_);
            for(; cur != end; ++cur)
            {
                *cur = detail::translate(*cur, tr, icase_type());
            }
            this->end_ = detail::data_end(str_);
        }